

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<Fad<long_double>_>::Subst_Backward
          (TPZMatrix<Fad<long_double>_> *this,TPZFMatrix<Fad<long_double>_> *B)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  unkbyte10 Var4;
  unkbyte10 Var5;
  unkbyte10 Var6;
  unkbyte10 Var7;
  unkbyte10 Var8;
  int iVar9;
  undefined4 extraout_var;
  long lVar10;
  undefined4 extraout_var_01;
  int iVar11;
  undefined8 extraout_RDX;
  undefined8 uVar12;
  undefined8 extraout_RDX_00;
  long lVar13;
  int i;
  long lVar14;
  ulong uVar15;
  unkbyte10 in_ST0;
  unkbyte10 Var16;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  unkbyte10 in_ST4;
  unkbyte10 in_ST5;
  unkbyte10 Var17;
  Fad<long_double> sum;
  Fad<long_double> pivot;
  FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_> local_118;
  Fad<long_double> local_108;
  Fad<long_double> local_d8;
  Fad<long_double> *local_a8;
  Fad<long_double> *local_a0;
  Fad<long_double> local_98;
  Fad<long_double> local_68;
  int extraout_var_00;
  
  lVar10 = (B->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow;
  iVar9 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  iVar11 = 0;
  if ((lVar10 == CONCAT44(extraout_var,iVar9)) &&
     ((this->super_TPZBaseMatrix).fDecomposed == '\x03')) {
    iVar9 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    lVar10 = CONCAT44(extraout_var_00,iVar9);
    iVar11 = 1;
    if (lVar10 != 0 && -1 < extraout_var_00) {
      do {
        lVar1 = lVar10 + -1;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(&local_68,this,lVar1)
        ;
        if (0 < (B->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fCol) {
          lVar13 = 0;
          do {
            local_d8.val_ = (longdouble)0;
            local_d8.dx_.num_elts = 0;
            local_d8.dx_.ptr_to_data = (longdouble *)0x0;
            local_d8.defaultVal._0_8_ = 0;
            local_d8.defaultVal._8_2_ = 0;
            iVar9 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
            lVar14 = CONCAT44(extraout_var_01,iVar9);
            while (lVar10 < lVar14) {
              lVar14 = lVar14 + -1;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_108,this,lVar1,lVar14);
              (*(B->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(&local_98,B,lVar14,lVar13);
              local_118.fadexpr_.left_ = &local_108;
              local_118.fadexpr_.right_ = &local_98;
              Fad<long_double>::operator+=(&local_d8,&local_118);
              Fad<long_double>::~Fad(&local_98);
              Fad<long_double>::~Fad(&local_108);
            }
            (*(B->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(&local_98,B,lVar1,lVar13);
            local_a0 = &local_d8;
            local_118.fadexpr_.left_ = (Fad<long_double> *)&local_a8;
            local_118.fadexpr_.right_ = &local_68;
            local_108.val_ = (local_98.val_ - local_d8.val_) / local_68.val_;
            uVar3 = local_d8.dx_.num_elts;
            if (local_d8.dx_.num_elts < local_98.dx_.num_elts) {
              uVar3 = local_98.dx_.num_elts;
            }
            if ((int)uVar3 <= local_68.dx_.num_elts) {
              uVar3 = local_68.dx_.num_elts;
            }
            local_108.dx_.num_elts = 0;
            local_108.dx_.ptr_to_data = (longdouble *)0x0;
            local_a8 = &local_98;
            if ((int)uVar3 < 1) {
              local_108.defaultVal = (longdouble)0;
            }
            else {
              Var17 = in_ST5;
              local_108.dx_.num_elts = uVar3;
              local_108.dx_.ptr_to_data = (longdouble *)operator_new__((ulong)uVar3 << 4);
              local_108.defaultVal = (longdouble)0;
              if (0 < (int)uVar3) {
                lVar14 = 0;
                uVar15 = 0;
                uVar12 = extraout_RDX;
                Var16 = in_ST0;
                Var4 = in_ST1;
                Var5 = in_ST2;
                Var6 = in_ST3;
                Var7 = in_ST4;
                Var8 = in_ST5;
                do {
                  in_ST5 = Var17;
                  in_ST4 = Var8;
                  in_ST3 = Var7;
                  in_ST2 = Var6;
                  in_ST1 = Var5;
                  in_ST0 = Var4;
                  Var17 = in_ST5;
                  FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>
                  ::dx((value_type *)&local_118,
                       (FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>
                        *)(uVar15 & 0xffffffff),(int)uVar12);
                  *(unkbyte10 *)((long)local_108.dx_.ptr_to_data + lVar14) = Var16;
                  uVar15 = uVar15 + 1;
                  lVar14 = lVar14 + 0x10;
                  uVar12 = extraout_RDX_00;
                  Var16 = in_ST0;
                  Var4 = in_ST1;
                  Var5 = in_ST2;
                  Var6 = in_ST3;
                  Var7 = in_ST4;
                  Var8 = in_ST5;
                } while (uVar3 != uVar15);
              }
            }
            (*(B->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x23])(B,lVar1,lVar13,&local_108);
            Fad<long_double>::~Fad(&local_108);
            Fad<long_double>::~Fad(&local_98);
            Fad<long_double>::~Fad(&local_d8);
            lVar13 = lVar13 + 1;
          } while (lVar13 < (B->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fCol);
        }
        Fad<long_double>::~Fad(&local_68);
        bVar2 = 1 < lVar10;
        lVar10 = lVar1;
      } while (bVar2);
      iVar11 = 1;
    }
  }
  return iVar11;
}

Assistant:

int TPZMatrix<TVar>::Subst_Backward( TPZFMatrix<TVar> *B ) const {
	
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky) return( 0 );
	for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
			//
			TVar sum = 0.0;
			for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
        }
    }
    return( 1 );
}